

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

String * __thiscall
capnp::compiler::BrandedDecl::toDebugString(String *__return_storage_ptr__,BrandedDecl *this)

{
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  *paVar1;
  ResolvedParameter variable;
  char (*in_stack_ffffffffffffff88) [3];
  uint local_6c;
  char local_68 [8];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  byte local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  paVar1 = &(this->body).field_1;
  if ((this->body).tag == 2) {
    local_68 = *(char (*) [8])paVar1;
    uStack_60 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    kj::str<char_const(&)[10],unsigned_long&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)"variable(",(char (*) [10])local_68,
               (unsigned_long *)", ",(char (*) [3])&uStack_60,(uint *)0x1c4f43,
               (char (*) [2])in_stack_ffffffffffffff88);
  }
  else {
    local_48 = *(undefined8 *)((long)&(this->body).field_1 + 0x20);
    local_68 = *(char (*) [8])paVar1;
    uStack_60 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    local_58 = *(undefined8 *)((long)&(this->body).field_1 + 0x10);
    uStack_50 = *(undefined8 *)((long)&(this->body).field_1 + 0x18);
    local_40 = (this->body).field_1.space[0x28];
    if (local_40 == '\x01') {
      local_38 = *(undefined8 *)((long)&(this->body).field_1 + 0x30);
      uStack_30 = *(undefined8 *)((long)&(this->body).field_1 + 0x38);
      local_28 = *(undefined8 *)((long)&(this->body).field_1 + 0x40);
      uStack_20 = *(undefined8 *)((long)&(this->body).field_1 + 0x48);
      local_18 = *(undefined8 *)((long)&(this->body).field_1 + 0x50);
      uStack_10 = *(undefined8 *)((long)&(this->body).field_1 + 0x58);
    }
    local_6c = (uint)(ushort)uStack_50;
    kj::str<char_const(&)[6],unsigned_long&,char_const(&)[3],unsigned_int,char_const(&)[3]>
              (__return_storage_ptr__,(kj *)"decl(",(char (*) [6])local_68,(unsigned_long *)", ",
               (char (*) [3])&local_6c,(uint *)"\')",in_stack_ffffffffffffff88);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String BrandedDecl::toDebugString() {
  if (body.is<Resolver::ResolvedParameter>()) {
    auto variable = body.get<Resolver::ResolvedParameter>();
    return kj::str("variable(", variable.id, ", ", variable.index, ")");
  } else {
    auto decl = body.get<Resolver::ResolvedDecl>();
    return kj::str("decl(", decl.id, ", ", (uint)decl.kind, "')");
  }
}